

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

SearchResult<int,_true> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
::binary_search_impl<std::__cxx11::string,phmap::priv::StringBtreeDefaultLess>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
           *this,undefined8 *k,uint s,uint e)

{
  void *__s2;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong __n;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar5 = (ulong)s;
  if (s == e) {
    uVar3 = 0x100000000;
  }
  else {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    __s2 = (void *)*k;
    uVar3 = k[1];
    uVar4 = 1;
    uVar6 = uVar5;
    uVar5 = (ulong)e;
    do {
      uVar7 = (int)uVar6 + (int)uVar5 >> 1;
      __n = *(ulong *)(this + (long)(int)uVar7 * 0x40 + 0x18);
      lVar8 = __n - uVar3;
      if (uVar3 <= __n) {
        __n = uVar3;
      }
      if ((__n == 0) ||
         (uVar1 = memcmp(*(void **)(this + (long)(int)uVar7 * 0x40 + 0x10),__s2,__n), uVar1 == 0)) {
        if (lVar8 < -0x7fffffff) {
          lVar8 = -0x80000000;
        }
        if (0x7ffffffe < lVar8) {
          lVar8 = 0x7fffffff;
        }
        uVar1 = (uint)lVar8;
      }
      uVar4 = uVar4 & 0xff;
      uVar2 = uVar1;
      if (uVar1 != 0) {
        uVar2 = uVar4;
      }
      if ((int)uVar1 < 0) {
        uVar6 = (ulong)(uVar7 + 1);
      }
      else {
        uVar5 = (ulong)uVar7;
        uVar4 = uVar2;
      }
    } while ((int)uVar6 != (int)uVar5);
    uVar3 = (ulong)(uVar4 & 0xff) << 0x20;
  }
  return (SearchResult<int,_true>)(uVar5 | uVar3);
}

Assistant:

SearchResult<int, true> binary_search_impl(
            const K &k, int s, int e, const CompareTo &comp,
            std::true_type /* IsCompareTo */) const {
            if (is_multi_container::value) {
                MatchKind exact_match = MatchKind::kNe;
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else {
                        e = mid;
                        if (c == 0) {
                            // Need to return the first value whose key is not less than k,
                            // which requires continuing the binary search if this is a
                            // multi-container.
                            exact_match = MatchKind::kEq;
                        }
                    }
                }
                return {s, exact_match};
            } else {  // Not a multi-container.
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else if (c > 0) {
                        e = mid;
                    } else {
                        return {mid, MatchKind::kEq};
                    }
                }
                return {s, MatchKind::kNe};
            }
        }